

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

bool cmCTestScriptHandler::WriteInitialCache(string *directory,string *text)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  undefined1 local_308 [8];
  cmGeneratedFileStream fout;
  cmAlphaNum local_70;
  undefined1 local_40 [8];
  string cacheFile;
  string *text_local;
  string *directory_local;
  
  cacheFile.field_2._8_8_ = text;
  cmAlphaNum::cmAlphaNum(&local_70,directory);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fout.field_0x260,"/CMakeCache.txt");
  cmStrCat<>((string *)local_40,&local_70,(cmAlphaNum *)&fout.field_0x260);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_308,(string *)local_40,false,None);
  bVar1 = std::ios::operator!((ios *)(local_308 + (long)*(_func_int **)((long)local_308 + -0x18)));
  bVar3 = (bVar1 & 1) == 0;
  if (bVar3) {
    lVar2 = std::__cxx11::string::data();
    std::__cxx11::string::size();
    std::ostream::write(local_308,lVar2);
    std::ostream::flush();
    std::ofstream::close();
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_308);
  std::__cxx11::string::~string((string *)local_40);
  return bVar3;
}

Assistant:

bool cmCTestScriptHandler::WriteInitialCache(const std::string& directory,
                                             const std::string& text)
{
  std::string cacheFile = cmStrCat(directory, "/CMakeCache.txt");
  cmGeneratedFileStream fout(cacheFile);
  if (!fout) {
    return false;
  }

  fout.write(text.data(), text.size());

  // Make sure the operating system has finished writing the file
  // before closing it.  This will ensure the file is finished before
  // the check below.
  fout.flush();
  fout.close();
  return true;
}